

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adl_lsp_server.h
# Opt level: O0

DidCloseTextDocumentParams *
lscpp::experimental::get_params<(lscpp::experimental::method_kind)6>
          (DidCloseTextDocumentParams *__return_storage_ptr__,any *params)

{
  any *params_local;
  
  std::any_cast<lscpp::protocol::DidCloseTextDocumentParams>(__return_storage_ptr__,params);
  return __return_storage_ptr__;
}

Assistant:

auto get_params(std::any params) {
  return std::any_cast<to_params_t<Kind>>(params);
}